

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::WriteMetaMetadata
          (BP5Writer *this,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MetaMetaBlocks)

{
  bool bVar1;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_RDI;
  MetaMetaInfoBlock *b;
  const_iterator __end2;
  const_iterator __begin2;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *__range2;
  int in_stack_0000006c;
  TransportMan *in_stack_00000070;
  char *in_stack_00000078;
  TransportMan *in_stack_00000080;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (MetaMetaInfoBlock *)
       std::
       vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
       ::begin(in_RDI);
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
         ::operator*(local_20);
    transportman::TransportMan::WriteFiles
              (in_stack_00000080,in_stack_00000078,(size_t)in_stack_00000070,in_stack_0000006c);
    transportman::TransportMan::WriteFiles
              (in_stack_00000080,in_stack_00000078,(size_t)in_stack_00000070,in_stack_0000006c);
    transportman::TransportMan::WriteFiles
              (in_stack_00000080,in_stack_00000078,(size_t)in_stack_00000070,in_stack_0000006c);
    transportman::TransportMan::WriteFiles
              (in_stack_00000080,in_stack_00000078,(size_t)in_stack_00000070,in_stack_0000006c);
    __gnu_cxx::
    __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
    ::operator++(local_20);
  }
  transportman::TransportMan::FlushFiles(in_stack_00000070,in_stack_0000006c);
  return;
}

Assistant:

void BP5Writer::WriteMetaMetadata(
    const std::vector<format::BP5Base::MetaMetaInfoBlock> MetaMetaBlocks)
{
    for (auto &b : MetaMetaBlocks)
    {
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaIDLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)&b.MetaMetaInfoLen, sizeof(size_t));
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaID, b.MetaMetaIDLen);
        m_FileMetaMetadataManager.WriteFiles((char *)b.MetaMetaInfo, b.MetaMetaInfoLen);
    }
    m_FileMetaMetadataManager.FlushFiles();
}